

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O3

void __thiscall wabt::interp::Istream::EmitInternal<unsigned_long>(Istream *this,unsigned_long val)

{
  pointer puVar1;
  ulong __new_size;
  ulong uVar2;
  
  puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  __new_size = (ulong)((int)uVar2 + 8);
  if (uVar2 < __new_size) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->data_,__new_size);
    puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
  }
  *(unsigned_long *)(puVar1 + (uVar2 & 0xffffffff)) = val;
  return;
}

Assistant:

void WABT_VECTORCALL Istream::EmitInternal(T val) {
  EmitAt(end(), val);
}